

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

unsigned_fast_type
math::wide_integer::lsb<512u,unsigned_int,void,false>
          (uintwide_t<512U,_unsigned_int,_void,_false> *x)

{
  uint uVar1;
  uint uVar2;
  unsigned_fast_type uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  
  uVar3 = 0;
  lVar4 = 0;
  lVar5 = 0;
  while( true ) {
    uVar1 = *(uint *)((long)(x->values).super_array<unsigned_int,_16UL>.elems + lVar4);
    if (uVar1 != 0) {
      if ((uVar1 & 1) == 0) {
        lVar6 = 0;
        uVar7 = uVar1;
        do {
          lVar6 = lVar6 + 1;
          uVar2 = uVar7 & 2;
          uVar7 = uVar7 >> 1;
        } while (uVar2 == 0);
      }
      else {
        lVar6 = 0;
      }
      uVar3 = lVar5 * 0x20 + lVar6;
    }
    if (uVar1 != 0) break;
    lVar4 = lVar4 + 4;
    lVar5 = lVar5 + 1;
    if (lVar4 == 0x40) {
      return uVar3;
    }
  }
  return uVar3;
}

Assistant:

constexpr auto lsb(const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& x) -> unsigned_fast_type
  {
    // Calculate the position of the least-significant bit.
    // Use a linear search starting from the least significant limb.

    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;
    using local_value_type        = typename local_wide_integer_type::representation_type::value_type;

    auto bpos   = static_cast<unsigned_fast_type>(UINT8_C(0));
    auto offset = static_cast<unsigned_fast_type>(UINT8_C(0));

    for(auto it = x.crepresentation().cbegin(); it != x.crepresentation().cend(); ++it, ++offset) // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)
    {
      const auto vi = static_cast<local_value_type>(*it & (std::numeric_limits<local_value_type>::max)());

      if(vi != static_cast<local_value_type>(UINT8_C(0)))
      {
        bpos =
          static_cast<unsigned_fast_type>
          (
              detail::lsb_helper(*it)
            + static_cast<unsigned_fast_type>
              (
                static_cast<unsigned_fast_type>(std::numeric_limits<local_value_type>::digits) * offset
              )
          );

        break;
      }
    }

    return bpos;
  }